

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.h
# Opt level: O0

void __thiscall despot::History::~History(History *this)

{
  History *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->observations_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->actions_);
  return;
}

Assistant:

void Add(ACT_TYPE action, OBS_TYPE obs) {
		actions_.push_back(action);
		observations_.push_back(obs);
	}